

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReader.hpp
# Opt level: O0

void __thiscall
FastqReader<FastqRecord>::FastqReader
          (FastqReader<FastqRecord> *this,FastxReaderParams params,string *filepath)

{
  undefined8 uVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  runtime_error *this_00;
  kstream<gzFile_s_*,_FunctorZlib> *pkVar5;
  string *in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  kseq *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 uVar6;
  char *in_stack_ffffffffffffff78;
  string local_48 [48];
  string *local_18;
  undefined4 local_4;
  
  local_18 = in_RDX;
  local_4 = in_ESI;
  kseq::kseq(in_stack_ffffffffffffff30);
  in_RDI[0x12] = 0;
  *(undefined4 *)(in_RDI + 0x14) = 0;
  *(undefined4 *)(in_RDI + 0x15) = local_4;
  ReaderStats::ReaderStats((ReaderStats *)(in_RDI + 0x16));
  *(undefined1 *)(in_RDI + 0x1a) = 0;
  uVar1 = std::__cxx11::string::c_str();
  uVar1 = gzopen(uVar1,"r");
  in_RDI[0x13] = uVar1;
  if (in_RDI[0x13] == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Error opening FASTQ ");
    poVar2 = std::operator<<(poVar2,local_18);
    poVar2 = std::operator<<(poVar2,": ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::operator<<(poVar2,pcVar4);
    std::ostream::operator<<((ostream *)__lhs,std::endl<char,std::char_traits<char>>);
    uVar6 = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_ffffffffffffff78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar6,in_stack_ffffffffffffff70));
    std::operator+(__lhs,(char *)this_00);
    piVar3 = __errno_location();
    strerror(*piVar3);
    std::operator+(__lhs,(char *)this_00);
    std::runtime_error::runtime_error(this_00,local_48);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pkVar5 = (kstream<gzFile_s_*,_FunctorZlib> *)operator_new(0x30);
  kstream<gzFile_s_*,_FunctorZlib>::kstream(pkVar5,in_RDI[0x13]);
  *in_RDI = pkVar5;
  return;
}

Assistant:

explicit FastqReader(FastxReaderParams params, const std::string &filepath) : params(params), numRecords(0),eof_flag(false) {
        //sdglib::OutputLog() << "Opening: " << filepath << "\n";
        gz_file = gzopen(filepath.c_str(), "r");
        if (gz_file == Z_NULL) {
            std::cout << "Error opening FASTQ " << filepath << ": " << std::strerror(errno) << std::endl;
            throw std::runtime_error("Error opening " + filepath + ": " + std::strerror(errno));
        }
        ks = new kstream<gzFile, FunctorZlib>(gz_file, gzr);
    }